

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void roundss_(PDISASM pMyDisasm)

{
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if (((pMyDisasm->Reserved_).VEX.pp == '\x01') && ((pMyDisasm->Reserved_).EVEX.W == '\0')) {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vrndscaless",0xc);
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
LAB_00138822:
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4,pMyDisasm);
      (pMyDisasm->Reserved_).MemDecoration = 0xcb;
      return;
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vroundss",9);
      goto LAB_00138822;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    (pMyDisasm->Instruction).Category = 0x8002b;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"roundss",8);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ roundss_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrndscaless");
        #endif
        GV.EVEX.tupletype = TUPLE1_SCALAR;
        ArgsVEX(pMyDisasm);
        getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
        GV.MemDecoration = Arg3dword;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vroundss");
      #endif
      ArgsVEX(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      GV.MemDecoration = Arg3dword;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    GV.MemDecoration = Arg2dword;
    pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+ROUND_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "roundss");
    #endif
    GV.Register_ = SSE_REG;
    GxEx(pMyDisasm);
    getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
  }
  else {
    failDecode(pMyDisasm);
  }
}